

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall
TCLAP::CmdLine::xorAdd(CmdLine *this,vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *ors)

{
  bool bVar1;
  reference ppAVar2;
  long *in_RDI;
  ArgVectorIterator it;
  string *in_stack_ffffffffffffff78;
  Arg *in_stack_ffffffffffffff80;
  Arg *this_00;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  iterator local_18;
  
  XorHandler::add((XorHandler *)in_stack_ffffffffffffff80,
                  (vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)in_stack_ffffffffffffff78);
  local_18 = std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                       ((vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)
                        in_stack_ffffffffffffff78);
  while( true ) {
    std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
              ((vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    in_stack_ffffffffffffff80 = (Arg *)&stack0xffffffffffffffe8;
    ppAVar2 = __gnu_cxx::
              __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
              ::operator*((__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                           *)in_stack_ffffffffffffff80);
    Arg::forceRequired(*ppAVar2);
    ppAVar2 = __gnu_cxx::
              __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
              ::operator*((__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                           *)in_stack_ffffffffffffff80);
    this_00 = *ppAVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    Arg::setRequireLabel(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
    ppAVar2 = __gnu_cxx::
              __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
              ::operator*(&stack0xffffffffffffffe8);
    (**(code **)(*in_RDI + 0x18))(in_RDI,*ppAVar2);
    __gnu_cxx::
    __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>::
    operator++((__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                *)this_00,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  }
  return;
}

Assistant:

inline void CmdLine::xorAdd( std::vector<Arg*>& ors )
{
	_xorHandler.add( ors );

	for (ArgVectorIterator it = ors.begin(); it != ors.end(); it++)
	{
		(*it)->forceRequired();
		(*it)->setRequireLabel( "OR required" );
		add( *it );
	}
}